

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int arena_i_destroy_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                       size_t newlen)

{
  ulong i;
  arena_t *arena;
  ctl_arena_t *pcVar1;
  ctl_arena_t *pcVar2;
  ctl_arenas_t *pcVar3;
  int iVar4;
  uint uVar5;
  ctl_arena_t *pcVar6;
  long *in_FS_OFFSET;
  
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (((oldp == (void *)0x0 && oldlenp == (size_t *)0x0) && newp == (void *)0x0) && newlen == 0) {
    i = mib[1];
    iVar4 = 0xe;
    if (((i >> 0x20 == 0) && (arena = (arena_t *)duckdb_je_arenas[i].repr, arena != (arena_t *)0x0))
       && (duckdb_je_manual_arena_base <= arena->ind)) {
      uVar5 = duckdb_je_arena_nthreads_get(arena,false);
      if (uVar5 == 0) {
        uVar5 = duckdb_je_arena_nthreads_get(arena,true);
        if (uVar5 == 0) {
          uVar5 = (uint)i;
          arena_reset_prepare_background_thread(tsd,uVar5);
          duckdb_je_arena_reset(tsd,arena);
          duckdb_je_arena_decay((tsdn_t *)tsd,arena,false,true);
          if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
            duckdb_je_tsd_fetch_slow((tsd_t *)(*in_FS_OFFSET + -0x2a90),false);
          }
          pcVar1 = ctl_arenas->duckdb_je_arenas[1];
          pcVar1->initialized = true;
          ctl_arena_refresh((tsdn_t *)tsd,arena,pcVar1,uVar5,true);
          duckdb_je_arena_destroy(tsd,arena);
          pcVar6 = arenas_i(i);
          pcVar6->initialized = false;
          (pcVar6->destroyed_link).qre_next = pcVar6;
          (pcVar6->destroyed_link).qre_prev = pcVar6;
          pcVar3 = ctl_arenas;
          pcVar1 = (ctl_arenas->destroyed).qlh_first;
          if (pcVar1 != (ctl_arena_t *)0x0) {
            (pcVar6->destroyed_link).qre_next = (pcVar1->destroyed_link).qre_prev;
            (pcVar1->destroyed_link).qre_prev = pcVar6;
            pcVar2 = (((pcVar6->destroyed_link).qre_prev)->destroyed_link).qre_next;
            (pcVar6->destroyed_link).qre_prev = pcVar2;
            (((pcVar1->destroyed_link).qre_prev)->destroyed_link).qre_next = pcVar1;
            (pcVar2->destroyed_link).qre_next = pcVar6;
            pcVar6 = (pcVar6->destroyed_link).qre_next;
          }
          (pcVar3->destroyed).qlh_first = pcVar6;
          arena_reset_finish_background_thread(tsd,uVar5);
          iVar4 = 0;
        }
      }
    }
  }
  else {
    iVar4 = 1;
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar4;
}

Assistant:

static int
arena_i_destroy_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;
	ctl_arena_t *ctl_darena, *ctl_arena;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);

	ret = arena_i_reset_destroy_helper(tsd, mib, miblen, oldp, oldlenp,
	    newp, newlen, &arena_ind, &arena);
	if (ret != 0) {
		goto label_return;
	}

	if (arena_nthreads_get(arena, false) != 0 || arena_nthreads_get(arena,
	    true) != 0) {
		ret = EFAULT;
		goto label_return;
	}

	arena_reset_prepare_background_thread(tsd, arena_ind);
	/* Merge stats after resetting and purging arena. */
	arena_reset(tsd, arena);
	arena_decay(tsd_tsdn(tsd), arena, false, true);
	ctl_darena = arenas_i(MALLCTL_ARENAS_DESTROYED);
	ctl_darena->initialized = true;
	ctl_arena_refresh(tsd_tsdn(tsd), arena, ctl_darena, arena_ind, true);
	/* Destroy arena. */
	arena_destroy(tsd, arena);
	ctl_arena = arenas_i(arena_ind);
	ctl_arena->initialized = false;
	/* Record arena index for later recycling via arenas.create. */
	ql_elm_new(ctl_arena, destroyed_link);
	ql_tail_insert(&ctl_arenas->destroyed, ctl_arena, destroyed_link);
	arena_reset_finish_background_thread(tsd, arena_ind);

	assert(ret == 0);
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);

	return ret;
}